

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.h
# Opt level: O3

void __thiscall
wasm::WasmBinaryWriter::WasmBinaryWriter
          (WasmBinaryWriter *this,Module *input,BufferWithRandomAccess *o,PassOptions *options)

{
  pthread_t pVar1;
  pointer *__ptr;
  
  (this->tableOfContents).functionBodies.
  super__Vector_base<wasm::WasmBinaryWriter::TableOfContents::Entry,_std::allocator<wasm::WasmBinaryWriter::TableOfContents::Entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tableOfContents).functionBodies.
  super__Vector_base<wasm::WasmBinaryWriter::TableOfContents::Entry,_std::allocator<wasm::WasmBinaryWriter::TableOfContents::Entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tableOfContents).functionBodies.
  super__Vector_base<wasm::WasmBinaryWriter::TableOfContents::Entry,_std::allocator<wasm::WasmBinaryWriter::TableOfContents::Entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->wasm = input;
  this->o = o;
  this->options = options;
  BinaryIndexes::BinaryIndexes(&this->indexes,input);
  (this->indexedTypes).types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->indexedTypes).types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->indexedTypes).types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->indexedTypes).indices._M_h._M_buckets = &(this->indexedTypes).indices._M_h._M_single_bucket
  ;
  (this->indexedTypes).indices._M_h._M_bucket_count = 1;
  (this->indexedTypes).indices._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->indexedTypes).indices._M_h._M_element_count = 0;
  (this->indexedTypes).indices._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->indexedTypes).indices._M_h._M_rehash_policy._M_next_resize = 0;
  (this->indexedTypes).indices._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->signatureIndexes)._M_h._M_buckets = &(this->signatureIndexes)._M_h._M_single_bucket;
  (this->signatureIndexes)._M_h._M_bucket_count = 1;
  (this->signatureIndexes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->signatureIndexes)._M_h._M_element_count = 0;
  (this->signatureIndexes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->signatureIndexes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->signatureIndexes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->debugInfo = true;
  this->emitModuleName = true;
  this->sourceMap = (ostream *)0x0;
  (this->sourceMapUrl)._M_dataplus._M_p = (pointer)&(this->sourceMapUrl).field_2;
  (this->sourceMapUrl)._M_string_length = 0;
  (this->sourceMapUrl).field_2._M_local_buf[0] = '\0';
  (this->symbolMap)._M_dataplus._M_p = (pointer)&(this->symbolMap).field_2;
  (this->symbolMap)._M_string_length = 0;
  (this->symbolMap).field_2._M_local_buf[0] = '\0';
  pVar1 = pthread_self();
  (this->allocator).chunks.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->allocator).chunks.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->allocator).chunks.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->allocator).index = 0;
  (this->allocator).threadId._M_thread = pVar1;
  LOCK();
  (this->allocator).next._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  (this->sourceMapLocations).
  super__Vector_base<std::pair<unsigned_long,_const_wasm::Function::DebugLocation_*>,_std::allocator<std::pair<unsigned_long,_const_wasm::Function::DebugLocation_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->sourceMapLocations).
  super__Vector_base<std::pair<unsigned_long,_const_wasm::Function::DebugLocation_*>,_std::allocator<std::pair<unsigned_long,_const_wasm::Function::DebugLocation_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sourceMapLocations).
  super__Vector_base<std::pair<unsigned_long,_const_wasm::Function::DebugLocation_*>,_std::allocator<std::pair<unsigned_long,_const_wasm::Function::DebugLocation_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lastDebugLocation).symbolNameIndex.super__Optional_base<unsigned_int,_true,_true>.
  _M_payload.super__Optional_payload_base<unsigned_int>._M_engaged = false;
  (this->importInfo)._M_t.
  super___uniq_ptr_impl<wasm::ImportInfo,_std::default_delete<wasm::ImportInfo>_>._M_t.
  super__Tuple_impl<0UL,_wasm::ImportInfo_*,_std::default_delete<wasm::ImportInfo>_>.
  super__Head_base<0UL,_wasm::ImportInfo_*,_false>._M_head_impl = (ImportInfo *)0x0;
  (this->binaryLocations).expressions._M_h._M_buckets =
       &(this->binaryLocations).expressions._M_h._M_single_bucket;
  (this->binaryLocations).expressions._M_h._M_bucket_count = 1;
  (this->binaryLocations).expressions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->binaryLocations).expressions._M_h._M_element_count = 0;
  (this->binaryLocations).expressions._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->binaryLocations).expressions._M_h._M_rehash_policy._M_next_resize = 0;
  (this->binaryLocations).expressions._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->binaryLocations).delimiters._M_h._M_buckets =
       &(this->binaryLocations).delimiters._M_h._M_single_bucket;
  (this->binaryLocations).delimiters._M_h._M_bucket_count = 1;
  (this->binaryLocations).delimiters._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->binaryLocations).delimiters._M_h._M_element_count = 0;
  (this->binaryLocations).delimiters._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->binaryLocations).delimiters._M_h._M_rehash_policy._M_next_resize = 0;
  (this->binaryLocations).delimiters._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->binaryLocations).functions._M_h._M_buckets =
       &(this->binaryLocations).functions._M_h._M_single_bucket;
  (this->binaryLocations).functions._M_h._M_bucket_count = 1;
  (this->binaryLocations).functions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->binaryLocations).functions._M_h._M_element_count = 0;
  (this->binaryLocations).functions._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->binaryLocations).functions._M_h._M_rehash_policy._M_next_resize = 0;
  (this->binaryLocations).functions._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->binaryLocationTrackedExpressionsForFunc).
  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->binaryLocationTrackedExpressionsForFunc).
  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->binaryLocationTrackedExpressionsForFunc).
  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->funcMappedLocals)._M_h._M_buckets = &(this->funcMappedLocals)._M_h._M_single_bucket;
  (this->funcMappedLocals)._M_h._M_bucket_count = 1;
  (this->funcMappedLocals)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->funcMappedLocals)._M_h._M_element_count = 0;
  (this->funcMappedLocals)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->funcMappedLocals)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->funcMappedLocals)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->stringIndexes)._M_h._M_buckets = &(this->stringIndexes)._M_h._M_single_bucket;
  (this->stringIndexes)._M_h._M_bucket_count = 1;
  (this->stringIndexes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->stringIndexes)._M_h._M_element_count = 0;
  (this->stringIndexes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->stringIndexes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->stringIndexes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  prepare(this);
  return;
}

Assistant:

WasmBinaryWriter(Module* input,
                   BufferWithRandomAccess& o,
                   const PassOptions& options)
    : wasm(input), o(o), options(options), indexes(*input) {
    prepare();
  }